

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

bool DumpPeerAddresses(ArgsManager *args,AddrMan *addr)

{
  ChaCha20 *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  path src;
  path dest;
  FILE *__stream;
  bool bVar3;
  uint64_t uVar4;
  FILE *file;
  CChainParams *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  bool bVar6;
  unsigned_short *in_R8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  void *pvVar7;
  undefined8 uVar8;
  long lVar9;
  undefined1 auStack_210 [14];
  uint16_t randv;
  undefined1 *puVar10;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe18 [16];
  path pathAddr;
  path local_190;
  AutoFile fileout;
  path local_138;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir((path *)&stack0xfffffffffffffe20,args,true);
  std::filesystem::__cxx11::path::_M_append((path *)&stack0xfffffffffffffe20,9,"peers.dat");
  std::filesystem::__cxx11::path::path(&pathAddr.super_path,(path *)&stack0xfffffffffffffe20);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffe20);
  puVar10 = &stack0xfffffffffffffe10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe00,"peers","");
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar4 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  this = (ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4);
  ChaCha20::~ChaCha20(this);
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv;
  randv = (uint16_t)uVar4;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",&stack0xfffffffffffffe00,args_00,in_R8);
  ArgsManager::GetDataDir((path *)&local_138,&gArgs,true);
  paVar1 = &local_190._M_pathname.field_2;
  local_190._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_190,tmpfn._M_dataplus._M_p,
             tmpfn._M_dataplus._M_p + tmpfn._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&hashwriter,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &local_190,auto_format);
  std::filesystem::__cxx11::path::path((path *)&fileout,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_190._M_pathname._M_dataplus._M_p,
                    local_190._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_138,(path *)&fileout);
  std::filesystem::__cxx11::path::path(&pathTmp.super_path,&local_138);
  std::filesystem::__cxx11::path::~path((path *)&fileout);
  std::filesystem::__cxx11::path::~path(&local_138);
  file = fsbridge::fopen((char *)&pathTmp.super_path,"wb");
  pvVar7 = (void *)0x0;
  uVar8 = 0;
  lVar9 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&fileout,(FILE *)file,data_xor);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,lVar9 - (long)pvVar7);
  }
  if (fileout.m_file == (FILE *)0x0) {
    fileout.m_file = (FILE *)0x0;
    std::filesystem::remove(&pathTmp.super_path);
    hashwriter.super_HashWriter.ctx.s._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&hashwriter,pathTmp.super_path._M_pathname._M_dataplus._M_p,
               pathTmp.super_path._M_pathname._M_dataplus._M_p +
               pathTmp.super_path._M_pathname._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_00._M_len = 0x5a;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,ALL,Error,(ConstevalFormatString<2U>)0xf8eadb
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
LAB_008545c8:
    if ((ChaCha20 *)hashwriter.super_HashWriter.ctx.s._0_8_ != this) {
      operator_delete((void *)hashwriter.super_HashWriter.ctx.s._0_8_,
                      hashwriter.super_HashWriter.ctx.s._16_8_ + 1);
    }
  }
  else {
    hashwriter.super_HashWriter.ctx.buf[0x30] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x31] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x32] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x33] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x34] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x35] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x36] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x37] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x38] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x39] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x20] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x21] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x22] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x23] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x24] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x25] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x26] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x27] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x28] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x29] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x10] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x11] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x12] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x13] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x14] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x15] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x16] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x17] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x18] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x19] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0] = '\0';
    hashwriter.super_HashWriter.ctx.buf[1] = '\0';
    hashwriter.super_HashWriter.ctx.buf[2] = '\0';
    hashwriter.super_HashWriter.ctx.buf[3] = '\0';
    hashwriter.super_HashWriter.ctx.buf[4] = '\0';
    hashwriter.super_HashWriter.ctx.buf[5] = '\0';
    hashwriter.super_HashWriter.ctx.buf[6] = '\0';
    hashwriter.super_HashWriter.ctx.buf[7] = '\0';
    hashwriter.super_HashWriter.ctx.buf[8] = '\0';
    hashwriter.super_HashWriter.ctx.buf[9] = '\0';
    hashwriter.super_HashWriter.ctx.buf[10] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xb] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xc] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xd] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xe] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xf] = '\0';
    hashwriter.super_HashWriter.ctx.s[4] = 0;
    hashwriter.super_HashWriter.ctx.s[5] = 0;
    hashwriter.super_HashWriter.ctx.s[6] = 0;
    hashwriter.super_HashWriter.ctx.s[7] = 0;
    hashwriter.super_HashWriter.ctx.s[0] = 0;
    hashwriter.super_HashWriter.ctx.s[1] = 0;
    hashwriter.super_HashWriter.ctx.s[2] = 0;
    hashwriter.super_HashWriter.ctx.s[3] = 0;
    hashwriter.super_HashWriter.ctx.bytes = 0;
    CSHA256::CSHA256((CSHA256 *)&hashwriter);
    hashwriter.m_source = &fileout;
    pCVar5 = Params();
    AutoFile::write(hashwriter.m_source,(int)&pCVar5->pchMessageStart,(void *)0x4,(size_t)args_00);
    CSHA256::Write((CSHA256 *)&hashwriter,(pCVar5->pchMessageStart)._M_elems,4);
    AddrMan::Serialize<HashedSourceWriter<AutoFile>>(addr,&hashwriter);
    HashWriter::GetHash((uint256 *)&local_190,&hashwriter.super_HashWriter);
    AutoFile::write(&fileout,(int)&local_190,(void *)0x20,(size_t)args_00);
    bVar3 = AutoFile::Commit(&fileout);
    __stream = fileout.m_file;
    fileout.m_file = (FILE *)0x0;
    if (!bVar3) {
      if (__stream != (FILE *)0x0) {
        fclose((FILE *)__stream);
      }
      std::filesystem::remove(&pathTmp.super_path);
      hashwriter.super_HashWriter.ctx.s._0_8_ = this;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&hashwriter,pathTmp.super_path._M_pathname._M_dataplus._M_p,
                 pathTmp.super_path._M_pathname._M_dataplus._M_p +
                 pathTmp.super_path._M_pathname._M_string_length);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
      ;
      source_file_01._M_len = 0x5a;
      logging_function_01._M_str = "SerializeFileDB";
      logging_function_01._M_len = 0xf;
      LogPrintFormatInternal<char[16],std::__cxx11::string>
                (logging_function_01,source_file_01,0x4f,ALL,Error,
                 (ConstevalFormatString<2U>)0xf8eaf7,(char (*) [16])"SerializeFileDB",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
      goto LAB_008545c8;
    }
    if (__stream != (FILE *)0x0) {
      fclose((FILE *)__stream);
    }
    std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
    std::filesystem::__cxx11::path::path(&local_190,&pathAddr.super_path);
    src.super_path._M_pathname._M_string_length = uVar8;
    src.super_path._M_pathname._M_dataplus._M_p = (pointer)pvVar7;
    src.super_path._M_pathname.field_2._M_allocated_capacity = lVar9;
    src.super_path._24_14_ = auStack_210;
    src.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._6_2_
         = randv;
    dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffe08;
    dest.super_path._M_pathname._M_dataplus._M_p = puVar10;
    dest.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffe10;
    dest.super_path._24_16_ = in_stack_fffffffffffffe18;
    bVar3 = RenameOver(src,dest);
    std::filesystem::__cxx11::path::~path(&local_190);
    std::filesystem::__cxx11::path::~path((path *)&hashwriter);
    bVar6 = true;
    if (bVar3) goto LAB_008545e7;
    std::filesystem::remove(&pathTmp.super_path);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "SerializeFileDB";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<char[16]>
              (logging_function,source_file,0x57,ALL,Error,(ConstevalFormatString<1U>)0xf8eb14,
               (char (*) [16])"SerializeFileDB");
  }
  bVar6 = false;
LAB_008545e7:
  AutoFile::~AutoFile(&fileout);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmpfn._M_dataplus._M_p != &tmpfn.field_2) {
    operator_delete(tmpfn._M_dataplus._M_p,tmpfn.field_2._M_allocated_capacity + 1);
  }
  if (puVar10 != &stack0xfffffffffffffe10) {
    operator_delete(puVar10,in_stack_fffffffffffffe10 + 1);
  }
  std::filesystem::__cxx11::path::~path(&pathAddr.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool DumpPeerAddresses(const ArgsManager& args, const AddrMan& addr)
{
    const auto pathAddr = args.GetDataDirNet() / "peers.dat";
    return SerializeFileDB("peers", pathAddr, addr);
}